

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roundtrip.cpp
# Opt level: O2

void _DOCTEST_ANON_TMP_53<std::shared_ptr<int>>(void)

{
  int *__p;
  Result *in_R9;
  ExpressionDecomposer local_9c;
  shared_ptr<int> out;
  shared_ptr<int> in;
  element_type *local_78;
  Enum local_70;
  Result local_68;
  Result local_48;
  Result local_28;
  
  in.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  in.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (anonymous_namespace)::roundtrip<std::shared_ptr<int>>((_anonymous_namespace_ *)&out,&in);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_9c,DT_CHECK);
  local_78 = (element_type *)
             ((ulong)(out.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                     (element_type *)0x0) | (ulong)local_9c.m_at << 0x20);
  doctest::detail::Expression_lhs::operator_cast_to_Result(&local_28,(Expression_lhs *)&local_78);
  doctest::detail::decomp_assert
            ((detail *)0xa,0x18c19c,(char *)0x194,0x18c542,&local_28.m_passed,in_R9);
  doctest::String::~String(&local_28.m_decomp);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&out.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&in.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  __p = (int *)operator_new(4);
  *__p = 0x7b;
  std::__shared_ptr<int,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<int,void>
            ((__shared_ptr<int,(__gnu_cxx::_Lock_policy)2> *)&in,__p);
  (anonymous_namespace)::roundtrip<std::shared_ptr<int>>((_anonymous_namespace_ *)&out,&in);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_9c,DT_REQUIRE);
  local_78 = (element_type *)
             ((ulong)(out.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                     (element_type *)0x0) | (ulong)local_9c.m_at << 0x20);
  doctest::detail::Expression_lhs::operator_cast_to_Result(&local_48,(Expression_lhs *)&local_78);
  doctest::detail::decomp_assert
            ((detail *)0xc,0x18c19c,(char *)0x19b,0x18c541,&local_48.m_passed,in_R9);
  doctest::String::~String(&local_48.m_decomp);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_9c,DT_CHECK);
  local_78 = in.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_70 = local_9c.m_at;
  doctest::detail::Expression_lhs<int&>::operator==
            (&local_68,(Expression_lhs<int&> *)&local_78,
             out.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  doctest::detail::decomp_assert
            ((detail *)0xa,0x18c19c,(char *)0x19c,0x18c547,&local_68.m_passed,in_R9);
  doctest::String::~String(&local_68.m_decomp);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&out.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&in.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

int age(const int i) { return _age = i; }